

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O2

void __thiscall GlobOpt::ArraySrcOpt::InsertHeadSegmentLoad(ArraySrcOpt *this)

{
  undefined1 *puVar1;
  undefined2 valueType;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  ObjectType OVar5;
  uint uVar6;
  uint uVar7;
  DWORD offset;
  uint32 offset_00;
  JITTimeFunctionBody *pJVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  undefined4 *puVar11;
  RegOpnd *this_00;
  Opnd *this_01;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar12;
  Instr *this_02;
  Instr *this_03;
  StackSym *sym;
  char16_t *this_04;
  RegOpnd *baseOpnd_00;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  uVar6 = Func::GetSourceContextId(this->func);
  uVar7 = Func::GetLocalFunctionId(this->func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ArraySegmentHoistPhase,uVar6,uVar7);
  if (bVar4) {
    pJVar8 = Func::GetJITFunctionBody(this->func);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_88);
    Output::Print(L"Function %s (%s)",pcVar9,pcVar10);
    bVar4 = Func::IsLoopBody(this->func);
    if (bVar4) {
      uVar6 = JITTimeWorkItem::GetLoopNumber(this->func->m_workItem);
      Output::Print(L", loop %u",(ulong)uVar6);
    }
    pFVar2 = (*this->instr)->m_func;
    if (pFVar2 != this->func) {
      pJVar8 = Func::GetJITFunctionBody(pFVar2);
      pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
      pcVar10 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_88);
      Output::Print(L", Inlinee %s (%s)",pcVar9,pcVar10);
    }
    Output::Print(L" - %s\n    ",L"ArraySegmentHoist");
    IR::Instr::Dump(*this->instr);
    Output::Print(L"    ");
    Output::Print(L"Separating array segment load\n");
    Output::Flush();
  }
  uVar6 = Func::GetSourceContextId(this->func);
  uVar7 = Func::GetLocalFunctionId(this->func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ArraySegmentHoistPhase,uVar6,uVar7);
  if (bVar4) {
    pJVar8 = Func::GetJITFunctionBody((*this->instr)->m_func);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_88);
    Output::Print(L"Testtrace: %s function %s (%s): ",L"ArraySegmentHoist",pcVar9,pcVar10);
    Output::Print(L"Separating array segment load\n");
    Output::Flush();
  }
  sym = this->newHeadSegmentSym;
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0x648,"(newHeadSegmentSym)","newHeadSegmentSym");
    if (!bVar4) goto LAB_004598d0;
    *puVar11 = 0;
    sym = this->newHeadSegmentSym;
  }
  this_00 = IR::RegOpnd::New(sym,sym->m_type,(*this->instr)->m_func);
  IR::Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,true);
  this_01 = IR::Opnd::Copy(&this->baseOpnd->super_Opnd,(*this->instr)->m_func);
  baseOpnd = IR::Opnd::AsRegOpnd(this_01);
  IR::Opnd::SetIsJITOptimizedReg(&baseOpnd->super_Opnd,true);
  OVar5 = ValueType::GetObjectType(&this->baseValueType);
  if (OVar5 == ObjectWithArray) {
    offset = Js::DynamicObject::GetOffsetOfObjectArray();
    pIVar12 = IR::IndirOpnd::New(baseOpnd,offset,(baseOpnd->super_Opnd).m_type,
                                 (*this->instr)->m_func,false);
    this_02 = IR::Instr::New(LdIndir,&this_00->super_Opnd,&pIVar12->super_Opnd,
                             (*this->instr)->m_func);
  }
  else {
    this_02 = (Instr *)0x0;
  }
  baseOpnd_00 = this_00;
  if (this_02 == (Instr *)0x0) {
    baseOpnd_00 = baseOpnd;
  }
  valueType = this->baseValueType;
  offset_00 = Lowerer::GetArrayOffsetOfHeadSegment((ValueType)valueType);
  pIVar12 = IR::IndirOpnd::New(baseOpnd_00,offset_00,(this_00->super_Opnd).m_type,
                               (*this->instr)->m_func,false);
  this_03 = IR::Instr::New(LdIndir,&this_00->super_Opnd,&pIVar12->super_Opnd,(*this->instr)->m_func)
  ;
  if (this->hoistHeadSegmentLoadOutOfLoop == (Loop *)0x0) {
    if (this_02 != (Instr *)0x0) {
      IR::Instr::SetByteCodeOffset(this_02,*this->instr);
      IR::Instr::InsertBefore(this->insertBeforeInstr,this_02);
    }
    IR::Instr::SetByteCodeOffset(this_03,*this->instr);
    IR::Instr::InsertBefore(this->insertBeforeInstr,this_03);
    puVar1 = &(*this->instr)->field_0x36;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x400;
  }
  else {
    if ((this->isLikelyJsArray == true) &&
       (((this->hoistHeadSegmentLoadOutOfLoop->jsArrayKills).field_0.bits & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x66f,
                         "(!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments()))"
                         ,
                         "!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments())"
                        );
      if (!bVar4) {
LAB_004598d0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ArraySegmentHoistPhase,uVar6,uVar7);
    if (bVar4) {
      pJVar8 = Func::GetJITFunctionBody(this->func);
      pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
      pcVar10 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_88);
      Output::Print(L"Function %s (%s)",pcVar9,pcVar10);
      bVar4 = Func::IsLoopBody(this->func);
      if (bVar4) {
        uVar6 = JITTimeWorkItem::GetLoopNumber(this->func->m_workItem);
        Output::Print(L", loop %u",(ulong)uVar6);
      }
      pFVar2 = (*this->instr)->m_func;
      if (pFVar2 != this->func) {
        pJVar8 = Func::GetJITFunctionBody(pFVar2);
        pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
        pcVar10 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_88);
        Output::Print(L", Inlinee %s (%s)",pcVar9,pcVar10);
      }
      Output::Print(L" - %s\n    ",L"ArraySegmentHoist");
      IR::Instr::Dump(*this->instr);
      Output::Print(L"    ");
      uVar6 = Loop::GetLoopNumber(this->hoistHeadSegmentLoadOutOfLoop);
      Output::Print(L"Hoisting array segment load out of loop %u to landing pad block %u\n",
                    (ulong)uVar6,(ulong)this->hoistHeadSegmentLoadOutOfLoop->landingPad->number);
      Output::Flush();
    }
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    this_04 = (char16_t *)&DAT_014594b0;
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ArraySegmentHoistPhase,uVar6,uVar7);
    if (bVar4) {
      pJVar8 = Func::GetJITFunctionBody((*this->instr)->m_func);
      pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
      pcVar10 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_88);
      Output::Print(L"Testtrace: %s function %s (%s): ",L"ArraySegmentHoist",pcVar9,pcVar10);
      this_04 = L"Hoisting array segment load out of loop\n";
      Output::Print(L"Hoisting array segment load out of loop\n");
      Output::Flush();
    }
    if (this_02 != (Instr *)0x0) {
      InsertInstrInLandingPad((ArraySrcOpt *)this_04,this_02,this->hoistHeadSegmentLoadOutOfLoop);
    }
    InsertInstrInLandingPad((ArraySrcOpt *)this_04,this_03,this->hoistHeadSegmentLoadOutOfLoop);
  }
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::InsertHeadSegmentLoad()
{
    TRACE_TESTTRACE_PHASE_INSTR(Js::ArraySegmentHoistPhase, instr, _u("Separating array segment load\n"));

    Assert(newHeadSegmentSym);
    IR::RegOpnd *const headSegmentOpnd = IR::RegOpnd::New(newHeadSegmentSym, newHeadSegmentSym->GetType(), instr->m_func);
    headSegmentOpnd->SetIsJITOptimizedReg(true);

    IR::RegOpnd *const jitOptimizedBaseOpnd = baseOpnd->Copy(instr->m_func)->AsRegOpnd();
    jitOptimizedBaseOpnd->SetIsJITOptimizedReg(true);

    IR::Instr *loadObjectArray;
    if (baseValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        loadObjectArray =
            IR::Instr::New(
                Js::OpCode::LdIndir,
                headSegmentOpnd,
                IR::IndirOpnd::New(
                    jitOptimizedBaseOpnd,
                    Js::DynamicObject::GetOffsetOfObjectArray(),
                    jitOptimizedBaseOpnd->GetType(),
                    instr->m_func),
                instr->m_func);
    }
    else
    {
        loadObjectArray = nullptr;
    }

    IR::Instr *const loadHeadSegment =
        IR::Instr::New(
            Js::OpCode::LdIndir,
            headSegmentOpnd,
            IR::IndirOpnd::New(
                loadObjectArray ? headSegmentOpnd : jitOptimizedBaseOpnd,
                Lowerer::GetArrayOffsetOfHeadSegment(baseValueType),
                headSegmentOpnd->GetType(),
                instr->m_func),
            instr->m_func);

    if (hoistHeadSegmentLoadOutOfLoop)
    {
        Assert(!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments()));

        TRACE_PHASE_INSTR(
            Js::ArraySegmentHoistPhase,
            instr,
            _u("Hoisting array segment load out of loop %u to landing pad block %u\n"),
            hoistHeadSegmentLoadOutOfLoop->GetLoopNumber(),
            hoistHeadSegmentLoadOutOfLoop->landingPad->GetBlockNum());

        TESTTRACE_PHASE_INSTR(Js::ArraySegmentHoistPhase, instr, _u("Hoisting array segment load out of loop\n"));

        if (loadObjectArray)
        {
            InsertInstrInLandingPad(loadObjectArray, hoistHeadSegmentLoadOutOfLoop);
        }

        InsertInstrInLandingPad(loadHeadSegment, hoistHeadSegmentLoadOutOfLoop);
    }
    else
    {
        if (loadObjectArray)
        {
            loadObjectArray->SetByteCodeOffset(instr);
            insertBeforeInstr->InsertBefore(loadObjectArray);
        }

        loadHeadSegment->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(loadHeadSegment);
        instr->loadedArrayHeadSegment = true;
    }
}